

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
          (BasicResult<Catch::Clara::Detail::ParseState> *this,ResultType type,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type = type;
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00326b58;
  paVar1 = &(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (message->_M_dataplus)._M_p;
  paVar2 = &message->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&message->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_errorMessage).field_2 + 8) = uVar4;
  }
  else {
    (this->m_errorMessage)._M_dataplus._M_p = pcVar3;
    (this->m_errorMessage).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_errorMessage)._M_string_length = message->_M_string_length;
  (message->_M_dataplus)._M_p = (pointer)paVar2;
  message->_M_string_length = 0;
  (message->field_2)._M_local_buf[0] = '\0';
  if ((this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("m_type != ResultType::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x1250,
                "Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult(ResultType, std::string &&) [T = Catch::Clara::Detail::ParseState]"
               );
}

Assistant:

ResultBase( ResultType type ): m_type( type ) {}